

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunControlFlowOptimization(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmValue *pVVar1;
  VmValue *pVVar2;
  bool bVar3;
  uint uVar4;
  VmFunction *this;
  VmValue **ppVVar5;
  VmInstruction *pVVar6;
  VmInstruction *pVVar7;
  VmBlock *pVVar8;
  VmConstant *pVVar9;
  VmInstruction *first;
  VmBlock *replacement;
  VmInstruction *pVVar10;
  VmInstructionType VVar11;
  VmValue *local_170;
  VmValue *local_168;
  VmValue *local_160;
  VmInstruction *inst_3;
  uint i_2;
  bool hasPhiUser;
  VmBlock *target_1;
  VmBlock *next_2;
  VmBlock *curr_1;
  VmValue *targetBlock;
  VmValue *falseBlock_2;
  VmValue *trueBlock_2;
  VmInstruction *terminator_1;
  VmBlock *edge_1;
  VmInstruction *option_1;
  uint i_1;
  VmInstruction *phi_1;
  VmInstruction *terminator;
  VmValue *target;
  VmConstant *condition;
  VmBlock *edge;
  VmInstruction *option;
  uint i;
  VmValue *falseBlock_1;
  VmValue *trueBlock_1;
  VmInstruction *phi;
  VmValue *falseBlock;
  VmValue *trueBlock;
  VmBlock *next_1;
  VmInstruction *inst_2;
  VmInstruction *nextInst;
  VmInstruction *inst_1;
  VmBlock *next;
  VmInstruction *currLastInst;
  VmInstruction *inst;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  this = getType<VmFunction>(value);
  if (this != (VmFunction *)0x0) {
    inst = (VmInstruction *)this->firstBlock;
LAB_00217c4e:
    if (inst != (VmInstruction *)0x0) {
      for (currLastInst = (VmInstruction *)(inst->arguments).little[3];
          currLastInst != (VmInstruction *)0x0; currLastInst = currLastInst->nextSibling) {
        bVar3 = anon_unknown.dwarf_aa461::IsBlockTerminator(currLastInst->cmd);
        if (bVar3) goto LAB_00217c8a;
      }
      goto LAB_00217d05;
    }
    pVVar8 = this->firstBlock;
    while (next_2 = pVVar8, next_2 != (VmBlock *)0x0) {
      pVVar8 = next_2->nextSibling;
      if (((next_2->firstInstruction != (VmInstruction *)0x0) &&
          (next_2->firstInstruction == next_2->lastInstruction)) &&
         ((next_2->firstInstruction->cmd == VM_INST_JUMP && (next_2 != this->firstBlock)))) {
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&next_2->firstInstruction->arguments,0);
        replacement = getType<VmBlock>(*ppVVar5);
        if (replacement == (VmBlock *)0x0) {
          __assert_fail("target",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1450,
                        "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                       );
        }
        bVar3 = false;
        for (inst_3._0_4_ = 0;
            uVar4 = SmallArray<VmValue_*,_8U>::size(&(next_2->super_VmValue).users),
            (uint)inst_3 < uVar4; inst_3._0_4_ = (uint)inst_3 + 1) {
          ppVVar5 = SmallArray<VmValue_*,_8U>::operator[]
                              (&(next_2->super_VmValue).users,(uint)inst_3);
          pVVar10 = getType<VmInstruction>(*ppVVar5);
          if ((pVVar10 != (VmInstruction *)0x0) && (pVVar10->cmd == VM_INST_PHI)) {
            bVar3 = true;
            break;
          }
        }
        if (!bVar3) {
          anon_unknown.dwarf_aa461::ReplaceValueUsersWith
                    (module,&next_2->super_VmValue,&replacement->super_VmValue,
                     &module->controlFlowSimplifications);
        }
      }
      bVar3 = SmallArray<VmValue_*,_8U>::empty(&(next_2->super_VmValue).users);
      if ((bVar3) && (bVar3 = VmBlock::HasExternalInstructionUsers(next_2), !bVar3)) {
        VmFunction::RemoveBlock(this,next_2);
        module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
      }
    }
  }
  return;
LAB_00217c8a:
  while( true ) {
    bVar3 = false;
    if ((inst->arguments).allocator != (Allocator *)0x0) {
      bVar3 = (VmInstruction *)(inst->arguments).allocator != currLastInst;
    }
    if (!bVar3) break;
    module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
    VmBlock::RemoveInstruction((VmBlock *)inst,(VmInstruction *)(inst->arguments).allocator);
  }
LAB_00217d05:
  pVVar10 = (VmInstruction *)(inst->arguments).allocator;
  if (((((pVVar10 != (VmInstruction *)0x0) && (pVVar10->cmd == VM_INST_JUMP)) &&
       (pVVar1 = (inst->arguments).little[2], pVVar1 != (VmValue *)0x0)) &&
      ((ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,0), *ppVVar5 == pVVar1
       && (uVar4 = SmallArray<VmValue_*,_8U>::size(&pVVar1->users), uVar4 == 1)))) &&
     (ppVVar5 = SmallArray<VmValue_*,_8U>::operator[](&pVVar1->users,0),
     (VmInstruction *)*ppVVar5 == pVVar10)) {
    pVVar6 = (VmInstruction *)pVVar1[1].comment.end;
    while (nextInst = pVVar6, nextInst != (VmInstruction *)0x0) {
      pVVar6 = nextInst->nextSibling;
      if (nextInst->cmd == VM_INST_PHI) {
        uVar4 = SmallArray<VmValue_*,_4U>::size(&nextInst->arguments);
        bVar3 = false;
        if (uVar4 == 2) {
          ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&nextInst->arguments,1);
          bVar3 = (VmInstruction *)*ppVVar5 == inst;
        }
        if (!bVar3) {
          __assert_fail("inst->arguments.size() == 2 && inst->arguments[1] == curr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x13c6,
                        "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                       );
        }
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&nextInst->arguments,0);
        anon_unknown.dwarf_aa461::ReplaceValueUsersWith
                  (module,&nextInst->super_VmValue,*ppVVar5,&module->controlFlowSimplifications);
      }
    }
    for (next_1 = (VmBlock *)pVVar1[1].comment.end; next_1 != (VmBlock *)0x0;
        next_1 = (VmBlock *)(next_1->predecessors).data) {
      next_1->insertPoint = inst;
    }
    if ((inst->arguments).allocator != (Allocator *)0x0) {
      (inst->arguments).allocator[0x1d]._vptr_Allocator = (_func_int **)pVVar1[1].comment.end;
    }
    if (pVVar1[1].comment.end != (char *)0x0) {
      *(Allocator **)(pVVar1[1].comment.end + 0xe0) = (inst->arguments).allocator;
      (inst->arguments).allocator = *(Allocator **)&pVVar1[1].hasSideEffects;
    }
    pVVar1[1].hasSideEffects = false;
    pVVar1[1].hasMemoryAccess = false;
    pVVar1[1].canBeRemoved = false;
    pVVar1[1].hasKnownSimpleUse = false;
    pVVar1[1].hasKnownNonSimpleUse = false;
    *(undefined3 *)&pVVar1[1].field_0x3d = 0;
    pVVar1[1].comment.end = (char *)0x0;
    if (pVVar10->parent != (VmBlock *)0x0) {
      VmBlock::RemoveInstruction((VmBlock *)inst,pVVar10);
    }
    module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
  }
  if (((pVVar10 != (VmInstruction *)0x0) &&
      ((pVVar10->cmd == VM_INST_JUMP_Z || (pVVar10->cmd == VM_INST_JUMP_NZ)))) &&
     (pVVar1 = (inst->arguments).little[2],
     ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,2), *ppVVar5 == pVVar1)) {
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,1);
    pVVar1 = *ppVVar5;
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,2);
    pVVar2 = *ppVVar5;
    VVar11 = VM_INST_JUMP_Z;
    if (pVVar10->cmd == VM_INST_JUMP_Z) {
      VVar11 = VM_INST_JUMP_NZ;
    }
    pVVar10->cmd = VVar11;
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,1);
    *ppVVar5 = pVVar2;
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,2);
    *ppVVar5 = pVVar1;
    module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
  }
  if ((pVVar10 != (VmInstruction *)0x0) &&
     ((pVVar10->cmd == VM_INST_JUMP_Z || (pVVar10->cmd == VM_INST_JUMP_NZ)))) {
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,0);
    pVVar6 = getType<VmInstruction>(*ppVVar5);
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,1);
    pVVar1 = *ppVVar5;
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,2);
    pVVar2 = *ppVVar5;
    if ((pVVar6 != (VmInstruction *)0x0) &&
       (((pVVar6->cmd == VM_INST_PHI && (pVVar6 == pVVar10->prevSibling)) &&
        (pVVar6 == (VmInstruction *)(inst->arguments).little[3])))) {
      for (option._4_4_ = 0; uVar4 = SmallArray<VmValue_*,_4U>::size(&pVVar6->arguments),
          option._4_4_ < uVar4; option._4_4_ = option._4_4_ + 2) {
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,option._4_4_);
        pVVar7 = getType<VmInstruction>(*ppVVar5);
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,option._4_4_ + 1);
        pVVar8 = getType<VmBlock>(*ppVVar5);
        if (pVVar7->cmd == VM_INST_LOAD_IMMEDIATE) {
          ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
          pVVar9 = getType<VmConstant>(*ppVVar5);
          if (pVVar9->iValue == 0) {
            local_170 = pVVar1;
            if (pVVar10->cmd == VM_INST_JUMP_NZ) {
              local_170 = pVVar2;
            }
            local_168 = local_170;
          }
          else {
            local_160 = pVVar2;
            if (pVVar10->cmd == VM_INST_JUMP_NZ) {
              local_160 = pVVar1;
            }
            local_168 = local_160;
          }
          pVVar7 = pVVar8->lastInstruction;
          if (pVVar7->cmd == VM_INST_JUMP) {
            ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
            if ((VmInstruction *)*ppVVar5 != inst) {
              __assert_fail("terminator->arguments[0] == curr",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1412,
                            "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
            anon_unknown.dwarf_aa461::ReplaceValue(module,&pVVar7->super_VmValue,*ppVVar5,local_168)
            ;
            module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
          }
        }
      }
    }
  }
  if (((pVVar10 != (VmInstruction *)0x0) && (pVVar10->cmd == VM_INST_RETURN)) &&
     (bVar3 = SmallArray<VmValue_*,_4U>::empty(&pVVar10->arguments), !bVar3)) {
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,0);
    pVVar6 = getType<VmInstruction>(*ppVVar5);
    if (((pVVar6 != (VmInstruction *)0x0) && (pVVar6->cmd == VM_INST_PHI)) &&
       ((pVVar6 == pVVar10->prevSibling && (pVVar6 == (VmInstruction *)(inst->arguments).little[3]))
       )) {
      for (option_1._4_4_ = 0; uVar4 = SmallArray<VmValue_*,_4U>::size(&pVVar6->arguments),
          option_1._4_4_ < uVar4; option_1._4_4_ = option_1._4_4_ + 2) {
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,option_1._4_4_);
        first = getType<VmInstruction>(*ppVVar5);
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,option_1._4_4_ + 1);
        pVVar8 = getType<VmBlock>(*ppVVar5);
        pVVar7 = pVVar8->lastInstruction;
        if (pVVar7->cmd == VM_INST_JUMP) {
          ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
          if ((VmInstruction *)*ppVVar5 != inst) {
            __assert_fail("terminator->arguments[0] == curr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x142c,
                          "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          anon_unknown.dwarf_aa461::ChangeInstructionTo
                    (module,pVVar7,VM_INST_RETURN,&first->super_VmValue,(VmValue *)0x0,
                     (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                     &module->controlFlowSimplifications);
        }
      }
    }
  }
  if ((pVVar10 != (VmInstruction *)0x0) &&
     ((pVVar10->cmd == VM_INST_JUMP_Z || (pVVar10->cmd == VM_INST_JUMP_NZ)))) {
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,1);
    pVVar1 = *ppVVar5;
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,2);
    if (pVVar1 == *ppVVar5) {
      anon_unknown.dwarf_aa461::ChangeInstructionTo
                (module,pVVar10,VM_INST_JUMP,pVVar1,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                 (VmValue *)0x0,&module->controlFlowSimplifications);
    }
  }
  if (((pVVar10 != (VmInstruction *)0x0) && (pVVar10->cmd == VM_INST_UNYIELD)) &&
     (uVar4 = SmallArray<VmValue_*,_4U>::size(&pVVar10->arguments), uVar4 == 2)) {
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar10->arguments,1);
    anon_unknown.dwarf_aa461::ChangeInstructionTo
              (module,pVVar10,VM_INST_JUMP,*ppVVar5,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
               (VmValue *)0x0,&module->controlFlowSimplifications);
  }
  inst = (VmInstruction *)(inst->arguments).little[2];
  goto LAB_00217c4e;
}

Assistant:

void RunControlFlowOptimization(ExpressionContext &ctx, VmModule *module, VmValue *value)
{
	(void)ctx;

	if(VmFunction *function = getType<VmFunction>(value))
	{
		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		{
			// Remove any instructions after a branch
			for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
			{
				if(IsBlockTerminator(inst->cmd))
				{
					while(curr->lastInstruction && curr->lastInstruction != inst)
					{
						module->controlFlowSimplifications++;

						curr->RemoveInstruction(curr->lastInstruction);
					}
					break;
				}
			}

			// Merge together blocks if a block A ends with a branch to block B and block B only incoming blocks is block A
			VmInstruction *currLastInst = curr->lastInstruction;

			if(currLastInst && currLastInst->cmd == VM_INST_JUMP)
			{
				VmBlock *next = curr->nextSibling;

				if(next && currLastInst->arguments[0] == next && next->users.size() == 1 && next->users[0] == currLastInst)
				{
					// Fixup phi instructions
					for(VmInstruction *inst = next->firstInstruction; inst;)
					{
						VmInstruction *nextInst = inst->nextSibling;

						if(inst->cmd == VM_INST_PHI)
						{
							// Check that phi only expects us to come from the block we are merging with
							assert(inst->arguments.size() == 2 && inst->arguments[1] == curr);

							ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->controlFlowSimplifications);
						}

						inst = nextInst;
					}

					// Steal target block instructions
					for(VmInstruction *inst = next->firstInstruction; inst; inst = inst->nextSibling)
						inst->parent = curr;

					if(curr->lastInstruction)
						curr->lastInstruction->nextSibling = next->firstInstruction;

					if(next->firstInstruction)
					{
						next->firstInstruction->prevSibling = curr->lastInstruction;

						curr->lastInstruction = next->lastInstruction;
					}

					next->firstInstruction = next->lastInstruction = NULL;

					// Remove branch
					if(currLastInst->parent)
						curr->RemoveInstruction(currLastInst);

					module->controlFlowSimplifications++;
				}
			}

			// Reverse conditional branch so that the false block jump will jump further than the true block jump
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmBlock *next = curr->nextSibling;

				if(currLastInst->arguments[2] == next)
				{
					VmValue *trueBlock = currLastInst->arguments[1];
					VmValue *falseBlock = currLastInst->arguments[2];

					currLastInst->cmd = currLastInst->cmd == VM_INST_JUMP_Z ? VM_INST_JUMP_NZ : VM_INST_JUMP_Z;

					currLastInst->arguments[1] = falseBlock;
					currLastInst->arguments[2] = trueBlock;

					module->controlFlowSimplifications++;
				}
			}

			// If block contains a single conditional jump, and the condition is a phi node with constant arguments, try to redirect predecessor to our target
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmInstruction *phi = getType<VmInstruction>(currLastInst->arguments[0]);
				VmValue *trueBlock = currLastInst->arguments[1];
				VmValue *falseBlock = currLastInst->arguments[2];

				if(phi && phi->cmd == VM_INST_PHI && phi == currLastInst->prevSibling && phi == curr->firstInstruction)
				{
					for(unsigned i = 0; i < phi->arguments.size(); i += 2)
					{
						VmInstruction *option = getType<VmInstruction>(phi->arguments[i]);
						VmBlock *edge = getType<VmBlock>(phi->arguments[i + 1]);

						if(option->cmd != VM_INST_LOAD_IMMEDIATE)
							continue;

						VmConstant *condition = getType<VmConstant>(option->arguments[0]);

						VmValue *target = condition->iValue != 0 ? (currLastInst->cmd == VM_INST_JUMP_NZ ? trueBlock : falseBlock) : (currLastInst->cmd == VM_INST_JUMP_NZ ? falseBlock : trueBlock);

						VmInstruction *terminator = edge->lastInstruction;

						if(terminator->cmd == VM_INST_JUMP)
						{
							assert(terminator->arguments[0] == curr);

							ReplaceValue(module, terminator, terminator->arguments[0], target);

							module->controlFlowSimplifications++;
						}
					}
				}
			}

			// If block contains a return, and the return value is a phi node with constant arguments, try to return directly from predecessors
			if(currLastInst && currLastInst->cmd == VM_INST_RETURN && !currLastInst->arguments.empty())
			{
				VmInstruction *phi = getType<VmInstruction>(currLastInst->arguments[0]);

				if(phi && phi->cmd == VM_INST_PHI && phi == currLastInst->prevSibling && phi == curr->firstInstruction)
				{
					for(unsigned i = 0; i < phi->arguments.size(); i += 2)
					{
						VmInstruction *option = getType<VmInstruction>(phi->arguments[i]);
						VmBlock *edge = getType<VmBlock>(phi->arguments[i + 1]);

						VmInstruction *terminator = edge->lastInstruction;

						if(terminator->cmd == VM_INST_JUMP)
						{
							assert(terminator->arguments[0] == curr);

							ChangeInstructionTo(module, terminator, VM_INST_RETURN, option, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
						}
					}
				}
			}

			// Reverse conditional jump with unconditional if both targets are the same
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmValue *trueBlock = currLastInst->arguments[1];
				VmValue *falseBlock = currLastInst->arguments[2];

				if(trueBlock == falseBlock)
					ChangeInstructionTo(module, currLastInst, VM_INST_JUMP, trueBlock, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
			}

			// Remove coroutine unyield that only contains a single target
			if(currLastInst && currLastInst->cmd == VM_INST_UNYIELD && currLastInst->arguments.size() == 2)
			{
				VmValue *targetBlock = currLastInst->arguments[1];

				ChangeInstructionTo(module, currLastInst, VM_INST_JUMP, targetBlock, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
			}
		}

		for(VmBlock *curr = function->firstBlock; curr;)
		{
			VmBlock *next = curr->nextSibling;

			if(curr->firstInstruction && curr->firstInstruction == curr->lastInstruction && curr->firstInstruction->cmd == VM_INST_JUMP && curr != function->firstBlock)
			{
				// Remove blocks that only contain an unconditional branch to some other block
				VmBlock *target = getType<VmBlock>(curr->firstInstruction->arguments[0]);

				assert(target);

				// Do not replace block if it is an incoming phi instruction argument
				bool hasPhiUser = false;

				for(unsigned i = 0; i < curr->users.size(); i++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(curr->users[i]))
					{
						if(inst->cmd == VM_INST_PHI)
						{
							hasPhiUser = true;
							break;
						}
					}
				}

				if(!hasPhiUser)
					ReplaceValueUsersWith(module, curr, target, &module->controlFlowSimplifications);
			}

			if(curr->users.empty() && !curr->HasExternalInstructionUsers())
			{
				// Remove unused blocks
				function->RemoveBlock(curr);

				module->controlFlowSimplifications++;
			}

			curr = next;
		}
	}
}